

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_sethook(lua_State *L)

{
  int iVar1;
  lua_State *L1_00;
  char *smask_00;
  lua_Integer lVar2;
  char *smask;
  lua_State *L1;
  lua_Hook func;
  int local_18;
  int count;
  int mask;
  int arg;
  lua_State *L_local;
  
  _mask = L;
  L1_00 = getthread(L,&count);
  iVar1 = lua_type(_mask,count + 1);
  if (iVar1 < 1) {
    lua_settop(_mask,count + 1);
    L1 = (lua_State *)0x0;
    local_18 = 0;
    func._4_4_ = 0;
  }
  else {
    smask_00 = luaL_checklstring(_mask,count + 2,(size_t *)0x0);
    luaL_checktype(_mask,count + 1,6);
    lVar2 = luaL_optinteger(_mask,count + 3,0);
    func._4_4_ = (int)lVar2;
    L1 = (lua_State *)hookf;
    local_18 = makemask(smask_00,func._4_4_);
  }
  iVar1 = lua_rawgetp(_mask,-0xf4628,&HOOKKEY);
  if (iVar1 == 0) {
    lua_createtable(_mask,0,2);
    lua_pushvalue(_mask,-1);
    lua_rawsetp(_mask,-0xf4628,&HOOKKEY);
    lua_pushstring(_mask,"k");
    lua_setfield(_mask,-2,"__mode");
    lua_pushvalue(_mask,-1);
    lua_setmetatable(_mask,-2);
  }
  checkstack(_mask,L1_00,1);
  lua_pushthread(L1_00);
  lua_xmove(L1_00,_mask,1);
  lua_pushvalue(_mask,count + 1);
  lua_rawset(_mask,-3);
  lua_sethook(L1_00,(lua_Hook)L1,local_18,func._4_4_);
  return 0;
}

Assistant:

static int db_sethook (lua_State *L) {
  int arg, mask, count;
  lua_Hook func;
  lua_State *L1 = getthread(L, &arg);
  if (lua_isnoneornil(L, arg+1)) {  /* no hook? */
    lua_settop(L, arg+1);
    func = NULL; mask = 0; count = 0;  /* turn off hooks */
  }
  else {
    const char *smask = luaL_checkstring(L, arg+2);
    luaL_checktype(L, arg+1, LUA_TFUNCTION);
    count = (int)luaL_optinteger(L, arg + 3, 0);
    func = hookf; mask = makemask(smask, count);
  }
  if (lua_rawgetp(L, LUA_REGISTRYINDEX, &HOOKKEY) == LUA_TNIL) {
    lua_createtable(L, 0, 2);  /* create a hook table */
    lua_pushvalue(L, -1);
    lua_rawsetp(L, LUA_REGISTRYINDEX, &HOOKKEY);  /* set it in position */
    lua_pushstring(L, "k");
    lua_setfield(L, -2, "__mode");  /** hooktable.__mode = "k" */
    lua_pushvalue(L, -1);
    lua_setmetatable(L, -2);  /* setmetatable(hooktable) = hooktable */
  }
  checkstack(L, L1, 1);
  lua_pushthread(L1); lua_xmove(L1, L, 1);  /* key (thread) */
  lua_pushvalue(L, arg + 1);  /* value (hook function) */
  lua_rawset(L, -3);  /* hooktable[L1] = new Lua hook */
  lua_sethook(L1, func, mask, count);
  return 0;
}